

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::ParameterSymbol::getValue(ParameterSymbol *this,SourceRange referencingRange)

{
  Compilation *pCVar1;
  Scope *pSVar2;
  DeclaredType *pDVar3;
  bool bVar4;
  Type *this_00;
  ConstantValue *pCVar5;
  Diagnostic *pDVar6;
  Expression *expr;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_48;
  
  if (this->value == (ConstantValue *)0x0) {
    pSVar2 = (this->super_ValueSymbol).super_Symbol.parentScope;
    local_80._8_4_ = 0xffffffff;
    local_80._16_8_ = 0;
    local_80._24_8_ = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    if (this->isFromConf == true) {
      local_80._16_8_ = 0x10000000000;
    }
    local_80._0_8_ = pSVar2;
    if (this->evaluating != false) {
      pDVar6 = ASTContext::addDiag((ASTContext *)&local_80,(DiagCode)0x17000c,
                                   (this->super_ValueSymbol).super_Symbol.location);
      pDVar6 = Diagnostic::operator<<(pDVar6,(this->super_ValueSymbol).super_Symbol.name);
      Diagnostic::addNote(pDVar6,(DiagCode)0xd0001,referencingRange);
      return (ConstantValue *)ConstantValue::Invalid;
    }
    this->evaluating = true;
    expr = DeclaredType::getInitializer(&(this->super_ValueSymbol).declaredType);
    if (expr == (Expression *)0x0) {
      this->value = (ConstantValue *)ConstantValue::Invalid;
    }
    else {
      pCVar1 = pSVar2->compilation;
      ASTContext::eval((ConstantValue *)&local_48,(ASTContext *)&local_80,expr,
                       (bitmask<slang::ast::EvalFlags>)0x10);
      pCVar5 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                         (&pCVar1->constantAllocator,(ConstantValue *)&local_48);
      this->value = pCVar5;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_48);
      pDVar3 = (this->super_ValueSymbol).declaredType.typeOrLink.link;
      if ((((pDVar3 != (DeclaredType *)0x0 &&
             -1 < *(int *)&(this->super_ValueSymbol).declaredType.field_0x3c) &&
           (*(int *)&pDVar3->parent == 0xf7)) && (pDVar3->initializer == (Expression *)0x0)) &&
         (pDVar3[1].dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
        bVar4 = Expression::isImplicitString(expr);
        this->fromStringLit = bVar4;
      }
    }
    this->evaluating = false;
  }
  else if (this->needsCoercion == true) {
    pCVar1 = ((this->super_ValueSymbol).super_Symbol.parentScope)->compilation;
    this_00 = DeclaredType::getType(&(this->super_ValueSymbol).declaredType);
    Type::coerceValue((ConstantValue *)&local_80,this_00,this->value);
    pCVar5 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&pCVar1->constantAllocator,(ConstantValue *)&local_80);
    this->value = pCVar5;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_80);
    this->needsCoercion = false;
  }
  return this->value;
}

Assistant:

const ConstantValue& ParameterSymbol::getValue(SourceRange referencingRange) const {
    if (!value) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::max);
        if (isFromConf)
            ctx.flags |= ASTFlags::ConfigParam;

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            value = scope->getCompilation().allocConstant(
                ctx.eval(*init, EvalFlags::AllowUnboundedPlaceholder));

            // If this parameter has an implicit type declared and it was assigned
            // a string literal, make a note so that this parameter gets treated
            // as an implicit string itself in further expressions.
            auto typeSyntax = getDeclaredType()->getTypeSyntax();
            if (typeSyntax && typeSyntax->kind == SyntaxKind::ImplicitType) {
                auto& its = typeSyntax->as<ImplicitTypeSyntax>();
                if (!its.signing && its.dimensions.empty())
                    fromStringLit = init->isImplicitString();
            }
        }
        else {
            value = &ConstantValue::Invalid;
        }
    }
    else if (needsCoercion) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        value = scope->getCompilation().allocConstant(getType().coerceValue(*value));
        needsCoercion = false;
    }

    return *value;
}